

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O1

void __thiscall
cfgfile::tag_scalar_t<bool,_cfgfile::string_trait_t>::on_string
          (tag_scalar_t<bool,_cfgfile::string_trait_t> *this,
          parser_info_t<cfgfile::string_trait_t> *info,string_t *str)

{
  tag_t<cfgfile::string_trait_t> **pptVar1;
  bool bVar2;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  _Var3;
  exception_t<cfgfile::string_trait_t> *peVar4;
  pos_t pos;
  pos_t pos_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 *local_230;
  long local_228;
  undefined1 local_220 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string_t local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string_t local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_tag_t<cfgfile::string_trait_t>).m_is_defined != false) {
    peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"Value for the tag \"","");
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_1d0._M_dataplus._M_p,
               local_1d0._M_dataplus._M_p + local_1d0._M_string_length);
    std::operator+(&local_190,&local_1b0,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    local_230 = local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"\" already defined. In file \"","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_210,local_230,local_230 + local_228);
    std::operator+(&local_170,&local_190,&local_210);
    std::operator+(&local_150,&local_170,&info->m_file_name);
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"\" on line ","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_250,local_270,local_270 + local_268);
    std::operator+(&local_130,&local_150,&local_250);
    string_trait_t::to_string_abi_cxx11_(&local_1f0,(string_trait_t *)info->m_line_number,pos);
    std::operator+(&local_110,&local_130,&local_1f0);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,".","");
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_2b0._M_dataplus._M_p,
               local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
    std::operator+(&local_90,&local_110,&local_290);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_90);
    __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  pptVar1 = (this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
            super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>*const*,std::vector<cfgfile::tag_t<cfgfile::string_trait_t>*,std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>*>>>,__gnu_cxx::__ops::_Iter_pred<cfgfile::tag_t<cfgfile::string_trait_t>::is_any_child_defined()const::_lambda(cfgfile::tag_t<cfgfile::string_trait_t>*)_1_>>
                    ((this->super_tag_t<cfgfile::string_trait_t>).m_child_tags.
                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,pptVar1);
  if (_Var3._M_current == pptVar1) {
    bVar2 = format_t<bool,_cfgfile::string_trait_t>::from_string(info,str);
    this->m_value = bVar2;
    (this->super_tag_t<cfgfile::string_trait_t>).m_is_defined = true;
    return;
  }
  peVar4 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
  local_230 = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Value \"","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_210,local_230,local_230 + local_228);
  std::operator+(&local_1d0,&local_210,str);
  local_270 = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"\" for tag \"","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_250,local_270,local_270 + local_268);
  std::operator+(&local_1b0,&local_1d0,&local_250);
  std::operator+(&local_190,&local_1b0,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,"\" must be defined before any child tag. In file \"","");
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,local_290._M_dataplus._M_p,
             local_290._M_dataplus._M_p + local_290._M_string_length);
  std::operator+(&local_170,&local_190,&local_1f0);
  std::operator+(&local_150,&local_170,&info->m_file_name);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\" on line ","");
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2b0,local_d0,local_d0 + local_c8);
  std::operator+(&local_130,&local_150,&local_2b0);
  string_trait_t::to_string_abi_cxx11_(&local_70,(string_trait_t *)info->m_line_number,pos_00);
  std::operator+(&local_110,&local_130,&local_70);
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,".","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_f0,local_f0 + local_e8);
  std::operator+(&local_50,&local_110,&local_b0);
  exception_t<cfgfile::string_trait_t>::exception_t(peVar4,&local_50);
  __cxa_throw(peVar4,&exception_t<cfgfile::string_trait_t>::typeinfo,
              exception_t<cfgfile::string_trait_t>::~exception_t);
}

Assistant:

void on_string( const parser_info_t< Trait > & info,
		const typename Trait::string_t & str ) override
	{
		if( !this->is_defined_member_value() )
		{
			if( this->is_any_child_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Value \"" ) + str +
					Trait::from_ascii( "\" for tag \"" ) + this->name() +
					Trait::from_ascii( "\" must be defined before any child "
						"tag. In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );

			m_value = format_t< bool, Trait >::from_string( info, str );

			this->set_defined();
		}
		else
			throw exception_t< Trait >(
				Trait::from_ascii( "Value for the tag \"" ) +
				this->name() +
				Trait::from_ascii( "\" already defined. In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );
	}